

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

DropAction __thiscall
QMainWindowLayout::performPlatformWidgetDrag
          (QMainWindowLayout *this,QLayoutItem *widgetItem,QPoint *pressPosition)

{
  QArrayData *pQVar1;
  int iVar2;
  DropAction DVar3;
  undefined4 extraout_var;
  QMimeData *this_00;
  undefined4 extraout_var_00;
  QWindow *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArray local_a8;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(QLayoutItem **)(this + 0x808) = widgetItem;
  iVar2 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QDrag::QDrag((QDrag *)&local_88,(QObject *)CONCAT44(extraout_var,iVar2));
  this_00 = (QMimeData *)operator_new(0x10);
  QMimeData::QMimeData(this_00);
  iVar2 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
  pQVar4 = QWidget::windowHandle((QWidget *)CONCAT44(extraout_var_00,iVar2));
  QVar5.m_data = (storage_type *)0x26;
  QVar5.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar5);
  local_a8.d.d = (Data *)CONCAT44(uStack_54,local_58);
  local_68 = 0;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_78,2);
  QDataStream::operator<<((QDataStream *)&local_58,(longlong)pQVar4);
  pQVar1 = local_78;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_68 = 0;
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,1,0x10);
    }
  }
  QMimeData::setData((QString *)this_00,&local_a8);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar6.m_data = (storage_type *)0x28;
  QVar6.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar6);
  local_a8.d.d = (Data *)CONCAT44(uStack_54,local_58);
  local_a8.d.ptr = (char *)CONCAT44(uStack_4c,uStack_50);
  local_a8.d.size = CONCAT44(uStack_44,local_48);
  local_68 = 0;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_78,2);
  ::operator<<((QDataStream *)&local_58,pressPosition);
  pQVar1 = local_78;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_68 = 0;
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,1,0x10);
    }
  }
  QMimeData::setData((QString *)this_00,&local_a8);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QDrag::setMimeData((QMimeData *)&local_88);
  DVar3 = QDrag::exec((QMimeData *)&local_88,2);
  *(undefined8 *)(this + 0x808) = 0;
  QDrag::~QDrag((QDrag *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return DVar3;
  }
  __stack_chk_fail();
}

Assistant:

Qt::DropAction QMainWindowLayout::performPlatformWidgetDrag(QLayoutItem *widgetItem,
                                                            const QPoint &pressPosition)
{
    draggingWidget = widgetItem;
    QWidget *widget = widgetItem->widget();
    auto drag = QDrag(widget);
    auto mimeData = new QMimeData();
    auto window = widgetItem->widget()->windowHandle();

    auto serialize = [](const auto &object) {
        QByteArray data;
        QDataStream dataStream(&data, QIODevice::WriteOnly);
        dataStream << object;
        return data;
    };
    mimeData->setData("application/x-qt-mainwindowdrag-window"_L1,
                      serialize(reinterpret_cast<qintptr>(window)));
    mimeData->setData("application/x-qt-mainwindowdrag-position"_L1, serialize(pressPosition));
    drag.setMimeData(mimeData);

    auto result = drag.exec();

    draggingWidget = nullptr;
    return result;
}